

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_set_option(png_structrp png_ptr,int option,int onoff)

{
  uint uVar1;
  byte bVar2;
  
  bVar2 = (byte)option;
  if ((option & 1U) == 0 && ((uint)option < 0xe && png_ptr != (png_structrp)0x0)) {
    uVar1 = png_ptr->options;
    png_ptr->options = ~(3 << (bVar2 & 0x1f)) & uVar1 | 3 - (uint)(onoff == 0) << (bVar2 & 0x1f);
    return uVar1 >> (bVar2 & 0x1f) & 3;
  }
  return 1;
}

Assistant:

int PNGAPI
png_set_option(png_structrp png_ptr, int option, int onoff)
{
   if (png_ptr != NULL && option >= 0 && option < PNG_OPTION_NEXT &&
      (option & 1) == 0)
   {
      png_uint_32 mask = 3U << option;
      png_uint_32 setting = (2U + (onoff != 0)) << option;
      png_uint_32 current = png_ptr->options;

      png_ptr->options = (png_uint_32)((current & ~mask) | setting);

      return (int)(current & mask) >> option;
   }

   return PNG_OPTION_INVALID;
}